

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.h
# Opt level: O0

bool __thiscall httpparser::UrlParser::isUnreserved(UrlParser *this,char ch)

{
  int iVar1;
  char ch_local;
  UrlParser *this_local;
  
  iVar1 = isalnum((int)ch);
  if (iVar1 == 0) {
    iVar1 = (int)ch;
    if (((iVar1 - 0x2dU < 2) || (iVar1 == 0x5f)) || (iVar1 == 0x7e)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool isUnreserved(char ch) const
    {
        if( isalnum(ch) )
            return true;

        switch(ch)
        {
        case '-':
        case '.':
        case '_':
        case '~':
            return true;
        }

        return false;
    }